

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O3

string * __thiscall
helics::RandomDelayFilterOperation::getString_abi_cxx11_
          (string *__return_storage_ptr__,RandomDelayFilterOperation *this,string_view property)

{
  atomic<helics::RandomDistributions> aVar1;
  _Base_ptr p_Var2;
  long lVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  int *__s1;
  size_t __n;
  char *__s2;
  size_type __rlen;
  __atomic_float<double> _Var6;
  
  __s1 = (int *)property._M_str;
  __n = property._M_len;
  switch(__n) {
  case 3:
    iVar4 = bcmp(__s1,"min",__n);
    if (iVar4 != 0) {
      __s2 = "max";
LAB_0020b90c:
      iVar4 = bcmp(__s1,__s2,__n);
      if (iVar4 != 0) goto switchD_0020b89e_caseD_7;
LAB_0020b964:
      _Var6._M_fp = (((this->rdelayGen)._M_t.
                      super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
                      .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->
                    param2).super___atomic_float<double>._M_fp;
      goto LAB_0020b978;
    }
    break;
  case 4:
    if (*__s1 == 0x74736964) goto LAB_0020b9cc;
    iVar4 = bcmp(__s1,"mean",__n);
    if (iVar4 != 0) {
      __s2 = "beta";
      goto LAB_0020b90c;
    }
    break;
  case 5:
    iVar4 = bcmp(__s1,"alpha",__n);
    if (iVar4 != 0) goto switchD_0020b89e_caseD_7;
    break;
  case 6:
    iVar4 = bcmp(__s1,"param1",__n);
    if (iVar4 != 0) {
      iVar4 = bcmp(__s1,"param2",__n);
      if ((iVar4 != 0) && ((short)__s1[1] != 0x7665 || *__s1 != 0x64647473))
      goto switchD_0020b89e_caseD_7;
      goto LAB_0020b964;
    }
    break;
  default:
    goto switchD_0020b89e_caseD_7;
  case 0xc:
    iVar4 = bcmp(__s1,"distribution",__n);
    if (iVar4 != 0) goto switchD_0020b89e_caseD_7;
LAB_0020b9cc:
    aVar1._M_i = (((this->rdelayGen)._M_t.
                   super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
                   .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->dist
                 )._M_i;
    for (p_Var5 = (_Rb_tree_node_base *)distMap._24_8_;
        p_Var5 != (_Rb_tree_node_base *)(distMap + 8);
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      if (*(RandomDistributions *)&p_Var5[1]._M_left == aVar1._M_i) {
        p_Var2 = p_Var5[1]._M_parent;
        lVar3 = *(long *)(p_Var5 + 1);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,p_Var2,(long)&p_Var2->_M_color + lVar3);
        return __return_storage_ptr__;
      }
    }
switchD_0020b89e_caseD_7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  _Var6._M_fp = (((this->rdelayGen)._M_t.
                  super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
                  .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->
                param1).super___atomic_float<double>._M_fp;
LAB_0020b978:
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,vsnprintf,0x148,"%f",_Var6._M_fp);
  return __return_storage_ptr__;
}

Assistant:

std::string RandomDelayFilterOperation::getString(std::string_view property)
{
    if ((property == "dist") || (property == "distribution")) {
        auto currentDist = rdelayGen->dist.load();
        for (const auto& distPair : distMap) {
            if (distPair.second == currentDist) {
                return std::string(distPair.first);
            }
        }
    } else if ((property == "param1") || (property == "mean") || (property == "min") ||
               (property == "alpha")) {
        return std::to_string(rdelayGen->param1.load());
    } else if ((property == "param2") || (property == "stddev") || (property == "max") ||
               (property == "beta")) {
        return std::to_string(rdelayGen->param2.load());
    }
    return FilterOperations::getString(property);
}